

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

bool __thiscall dg::vr::RelationsAnalyzer::isSafe(RelationsAnalyzer *this,I inst)

{
  bool bVar1;
  ID id;
  ulong uVar2;
  Instruction *in_RDI;
  Function *function;
  CallInst *call;
  IntrinsicInst *intrinsic;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  byte bVar3;
  _Self in_stack_ffffffffffffff88;
  StringRef *in_stack_ffffffffffffffa8;
  _Self local_38;
  Function *local_30;
  ret_type local_28;
  ret_type local_20;
  bool local_1;
  
  uVar2 = llvm::Instruction::mayWriteToMemory();
  if (((uVar2 & 1) == 0) && (uVar2 = llvm::Instruction::mayHaveSideEffects(), (uVar2 & 1) == 0)) {
    local_1 = true;
  }
  else {
    local_20 = llvm::dyn_cast<llvm::IntrinsicInst,llvm::Instruction_const>(in_RDI);
    if (local_20 != (ret_type)0x0) {
      id = llvm::IntrinsicInst::getIntrinsicID((IntrinsicInst *)0x1ccf25);
      bVar1 = isIgnorableIntrinsic(id);
      if (bVar1) {
        return true;
      }
    }
    local_28 = llvm::dyn_cast<llvm::CallInst,llvm::Instruction_const>(in_RDI);
    if (local_28 != (ret_type)0x0) {
      local_30 = llvm::CallBase::getCalledFunction((CallBase *)in_stack_ffffffffffffff88._M_node);
      bVar3 = 0;
      if (local_30 != (Function *)0x0) {
        llvm::Value::getName();
        llvm::StringRef::str_abi_cxx11_(in_stack_ffffffffffffffa8);
        local_38._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78))
                    ,(key_type *)0x1ccfb8);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
        bVar3 = std::operator!=(&local_38,(_Self *)&stack0xffffffffffffff88);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
      }
      if ((bVar3 & 1) != 0) {
        return true;
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RelationsAnalyzer::isSafe(I inst) const {
    if (!inst->mayWriteToMemory() && !inst->mayHaveSideEffects())
        return true;

    if (const auto *intrinsic = llvm::dyn_cast<llvm::IntrinsicInst>(inst)) {
        if (isIgnorableIntrinsic(intrinsic->getIntrinsicID())) {
            return true;
        }
    }

    if (const auto *call = llvm::dyn_cast<llvm::CallInst>(inst)) {
        const auto *function = call->getCalledFunction();
        if (function && safeFunctions.find(function->getName().str()) !=
                                safeFunctions.end())
            return true;
    }
    return false;
}